

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consumer.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int consumer_id;
  ostream *poVar2;
  
  if (argc == 2) {
    consumer_id = atoi(argv[1]);
    LOOP_CNT = 10000;
    bVar1 = SharedMemRingBuffer::Init(&gSharedMemRingBuffer,0x1e240,0x2000,0xe1740,1000000);
    if (!bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"error");
      std::operator<<(poVar2,'\n');
    }
    else {
      TestFunc(consumer_id);
    }
    return (uint)!bVar1;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"usage: ");
  poVar2 = std::operator<<(poVar2,*argv);
  poVar2 = std::operator<<(poVar2," consumer_index");
  std::operator<<(poVar2,'\n');
  poVar2 = std::operator<<((ostream *)&std::cout,"ex: ");
  poVar2 = std::operator<<(poVar2,*argv);
  poVar2 = std::operator<<(poVar2," 0");
  std::operator<<(poVar2,'\n');
  poVar2 = std::operator<<((ostream *)&std::cout,"ex: ");
  poVar2 = std::operator<<(poVar2,*argv);
  poVar2 = std::operator<<(poVar2," 1");
  std::operator<<(poVar2,'\n');
  exit(1);
}

Assistant:

int main(int argc, char* argv[])
{
    if(argc != 2) {
        std::cout << "usage: "<< argv[0]<<" consumer_index"  << '\n';
        std::cout << "ex: "<< argv[0]<<" 0"  << '\n';
        std::cout << "ex: "<< argv[0]<<" 1"  << '\n';
        exit(1);
    }

    int consumer_id = atoi(argv[1]);
    LOOP_CNT = 10000;    //should be same as producer for TEST
    int MAX_RBUFFER_CAPACITY = 1024*8; //should be same as producer for TEST
    int MAX_RAW_MEM_BUFFER_SIZE = 1000000; //should be same as producer for TEST

    if(! gSharedMemRingBuffer.Init(123456,
                                   MAX_RBUFFER_CAPACITY, 
                                   923456,
                                   MAX_RAW_MEM_BUFFER_SIZE ) )
    { 
        std::cerr << "error" << '\n';
        return 1; 
    }

    TestFunc(consumer_id);

    return 0;
}